

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O1

int N_VConstrMask_MultiFab(N_Vector a,N_Vector x,N_Vector m)

{
  double dVar1;
  uint uVar2;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  MultiFab *this_01;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  Real RVar13;
  MFIter mfi;
  long local_200;
  long local_1f8;
  long local_1d8;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)x->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)a->content + 8);
  this_01 = *(MultiFab **)((long)m->content + 8);
  uVar2 = (this->super_FabArrayBase).n_comp;
  amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      amrex::BATransformer::operator()
                (&local_16c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_150,this_00,&local_90);
      if (0 < (int)uVar2) {
        lVar3 = (long)local_16c.smallend.vect[1];
        lVar7 = (long)local_16c.smallend.vect[0];
        local_1f8 = (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 + lVar7 * 8 +
                    (long)local_d0.begin.x * -8 + (long)local_d0.p;
        local_200 = (lVar3 - local_110.begin.y) * local_110.jstride * 8 + lVar7 * 8 +
                    (long)local_110.begin.x * -8 + (long)local_110.p;
        local_1d8 = (lVar3 - local_150.begin.y) * local_150.jstride * 8 + lVar7 * 8 +
                    (long)local_150.begin.x * -8 + (long)local_150.p;
        uVar6 = 0;
        do {
          iVar4 = local_16c.smallend.vect[2];
          if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
            do {
              if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
                lVar7 = (long)iVar4;
                lVar10 = (lVar7 - local_d0.begin.z) * local_d0.kstride * 8 + local_1f8;
                lVar8 = (lVar7 - local_110.begin.z) * local_110.kstride * 8 + local_200;
                lVar9 = (lVar7 - local_150.begin.z) * local_150.kstride * 8 + local_1d8;
                lVar7 = lVar3;
                do {
                  if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                    lVar5 = 0;
                    do {
                      *(undefined8 *)(lVar9 + lVar5 * 8) = 0;
                      dVar1 = *(double *)(lVar8 + lVar5 * 8);
                      if ((dVar1 != 0.0) || (NAN(dVar1))) {
                        dVar12 = dVar1 * *(double *)(lVar10 + lVar5 * 8);
                        if (((1.5 < ABS(dVar1)) && (dVar12 <= 0.0)) ||
                           ((0.5 < ABS(dVar1) && (dVar12 < 0.0)))) {
                          *(undefined8 *)(lVar9 + lVar5 * 8) = 0x3ff0000000000000;
                        }
                      }
                      lVar5 = lVar5 + 1;
                    } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 !=
                             (int)lVar5);
                  }
                  lVar7 = lVar7 + 1;
                  lVar10 = lVar10 + local_d0.jstride * 8;
                  lVar8 = lVar8 + local_110.jstride * 8;
                  lVar9 = lVar9 + local_150.jstride * 8;
                } while (local_16c.bigend.vect[1] + 1 != (int)lVar7);
              }
              bVar11 = iVar4 != local_16c.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar11);
          }
          uVar6 = uVar6 + 1;
          local_1f8 = local_1f8 + local_d0.nstride * 8;
          local_200 = local_200 + local_110.nstride * 8;
          local_1d8 = local_1d8 + local_150.nstride * 8;
        } while (uVar6 != uVar2);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  RVar13 = amrex::MultiFab::norm1(this_01,0,0,false);
  return -(uint)(RVar13 != 1.0) & 1;
}

Assistant:

int N_VConstrMask_MultiFab(N_Vector a, N_Vector x, N_Vector m)
{
    using namespace amrex;

    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_a = amrex::sundials::getMFptr(a);
    amrex::MultiFab *mf_m = amrex::sundials::getMFptr(m);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    amrex::Real temp = amrex::Real(0.0);
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi) {
        const amrex::Box& bx = mfi.validbox();
        Array4<Real> const& x_fab = mf_x->array(mfi);
        Array4<Real> const& a_fab = mf_a->array(mfi);
        Array4<Real> const& m_fab = mf_a->array(mfi);
        //Changing continue to if check, temp calculation should be changed to reduction
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
            {
                m_fab(i,j,k,c) = amrex::Real(0.0);

                /* Continue if no constraints were set for the variable */
                if (a_fab(i,j,k,c) != amrex::Real(0.0)) {

                    /* Check if a set constraint has been violated */
                    amrex::Real a, x;
                    a = a_fab(i,j,k,c);
                    x = x_fab(i,j,k,c);
                    int test = (SUNRabs(a) > amrex::Real(1.5) && x*a <= amrex::Real(0.0)) ||
                        (SUNRabs(a) > amrex::Real(0.5)   && x*a <  amrex::Real(0.0));
                    if (test) {
                        m_fab(i,j,k,c) = amrex::Real(1.0);
                    }
                }
            });
    }

    temp = mf_m->norm1();
    /* Return false if any constraint was violated */
    amrex::ParallelDescriptor::ReduceRealMax(temp);

    return (temp == amrex::Real(1.0)) ? SUNFALSE : SUNTRUE;
}